

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridge.cpp
# Opt level: O0

string * __thiscall
despot::BridgeState::text_abi_cxx11_(string *__return_storage_ptr__,BridgeState *this)

{
  string local_38;
  BridgeState *local_18;
  BridgeState *this_local;
  
  local_18 = this;
  this_local = (BridgeState *)__return_storage_ptr__;
  to_string<int>(&local_38,this->position);
  std::operator+(__return_storage_ptr__,"Man at ",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string BridgeState::text() const {
	return "Man at " + to_string(position);
}